

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightBounds * pbrt::Union(LightBounds *__return_storage_ptr__,LightBounds *a,LightBounds *b)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  bool bVar12;
  bool bVar13;
  float __x;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar21;
  undefined1 auVar20 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  DirectionCone c;
  DirectionCone local_70;
  DirectionCone local_58;
  DirectionCone local_40;
  
  if ((a->phi != 0.0) || (NAN(a->phi))) {
    if ((b->phi != 0.0) || (NAN(b->phi))) {
      uVar6._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar6._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar6;
      local_58.w.super_Tuple3<pbrt::Vector3,_float>.z = (a->w).super_Tuple3<pbrt::Vector3,_float>.z;
      local_58.cosTheta = a->cosTheta_o;
      auVar30._0_4_ = (float)(undefined4)uVar6 * (float)(undefined4)uVar6;
      auVar30._4_4_ = (float)uVar6._4_4_ * (float)uVar6._4_4_;
      auVar30._8_8_ = 0;
      auVar20 = vmovshdup_avx(auVar30);
      auVar20 = vfmadd231ss_fma(auVar20,auVar24,auVar24);
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)local_58.w.super_Tuple3<pbrt::Vector3,_float>.
                                                      z),
                                ZEXT416((uint)local_58.w.super_Tuple3<pbrt::Vector3,_float>.z));
      auVar20 = vsqrtss_avx(auVar20,auVar20);
      fVar14 = auVar20._0_4_;
      auVar33._4_4_ = fVar14;
      auVar33._0_4_ = fVar14;
      auVar33._8_4_ = fVar14;
      auVar33._12_4_ = fVar14;
      local_58.w.super_Tuple3<pbrt::Vector3,_float>.z =
           local_58.w.super_Tuple3<pbrt::Vector3,_float>.z / fVar14;
      auVar20 = vdivps_avx(auVar24,auVar33);
      local_58.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar20);
      local_58.empty = false;
      uVar7._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar7._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar7;
      local_70.w.super_Tuple3<pbrt::Vector3,_float>.z = (b->w).super_Tuple3<pbrt::Vector3,_float>.z;
      local_70.cosTheta = b->cosTheta_o;
      auVar31._0_4_ = (float)(undefined4)uVar7 * (float)(undefined4)uVar7;
      auVar31._4_4_ = (float)uVar7._4_4_ * (float)uVar7._4_4_;
      auVar31._8_8_ = 0;
      auVar20 = vmovshdup_avx(auVar31);
      auVar20 = vfmadd231ss_fma(auVar20,auVar25,auVar25);
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)local_70.w.super_Tuple3<pbrt::Vector3,_float>.
                                                      z),
                                ZEXT416((uint)local_70.w.super_Tuple3<pbrt::Vector3,_float>.z));
      auVar20 = vsqrtss_avx(auVar20,auVar20);
      fVar14 = auVar20._0_4_;
      auVar34._4_4_ = fVar14;
      auVar34._0_4_ = fVar14;
      auVar34._8_4_ = fVar14;
      auVar34._12_4_ = fVar14;
      local_70.w.super_Tuple3<pbrt::Vector3,_float>.z =
           local_70.w.super_Tuple3<pbrt::Vector3,_float>.z / fVar14;
      auVar20 = vdivps_avx(auVar25,auVar34);
      local_70.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar20);
      local_70.empty = false;
      Union(&local_40,&local_58,&local_70);
      auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_40.cosTheta));
      uVar15 = vcmpss_avx512f(ZEXT416((uint)local_40.cosTheta),SUB6416(ZEXT464(0xbf800000),0),1);
      bVar13 = (bool)((byte)uVar15 & 1);
      __x = acosf((float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * auVar20._0_4_));
      uVar2 = (b->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar8 = (b->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      auVar20._4_4_ = uVar8;
      auVar20._0_4_ = uVar2;
      auVar20._8_8_ = 0;
      uVar3 = (a->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar9 = (a->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      auVar26._4_4_ = uVar9;
      auVar26._0_4_ = uVar3;
      auVar26._8_8_ = 0;
      uVar4 = (b->b).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar10 = (b->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar35._4_4_ = uVar10;
      auVar35._0_4_ = uVar4;
      auVar35._8_8_ = 0;
      fVar14 = a->phi;
      bVar13 = b->twoSided;
      auVar28 = vminss_avx(ZEXT416((uint)(b->b).pMin.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(a->b).pMin.super_Tuple3<pbrt::Point3,_float>.z));
      auVar24 = vmaxss_avx(ZEXT416((uint)b->theta_e),ZEXT416((uint)a->theta_e));
      bVar12 = a->twoSided;
      fVar1 = b->phi;
      auVar26 = vminps_avx(auVar20,auVar26);
      uVar5 = (a->b).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar11 = (a->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar27._4_4_ = uVar11;
      auVar27._0_4_ = uVar5;
      auVar27._8_8_ = 0;
      auVar20 = vmaxps_avx(auVar35,auVar27);
      auVar25 = vmaxss_avx(ZEXT416((uint)(b->b).pMax.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(a->b).pMax.super_Tuple3<pbrt::Point3,_float>.z));
      uVar15 = vmovlps_avx(auVar26);
      (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar15;
      (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar15 >> 0x20);
      (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar28._0_4_;
      uVar15 = vmovlps_avx(auVar20);
      (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar15;
      (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar15 >> 0x20);
      auVar28._8_8_ = 0;
      auVar28._0_4_ = local_40.w.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar28._4_4_ = local_40.w.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar32._0_4_ =
           local_40.w.super_Tuple3<pbrt::Vector3,_float>.x *
           local_40.w.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar32._4_4_ =
           local_40.w.super_Tuple3<pbrt::Vector3,_float>.y *
           local_40.w.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar32._8_8_ = 0;
      (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar25._0_4_;
      auVar20 = vmovshdup_avx(auVar32);
      auVar20 = vfmadd231ss_fma(auVar20,auVar28,auVar28);
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)local_40.w.super_Tuple3<pbrt::Vector3,_float>.
                                                      z),
                                ZEXT416((uint)local_40.w.super_Tuple3<pbrt::Vector3,_float>.z));
      auVar20 = vsqrtss_avx(auVar20,auVar20);
      fVar29 = auVar20._0_4_;
      auVar36._4_4_ = fVar29;
      auVar36._0_4_ = fVar29;
      auVar36._8_4_ = fVar29;
      auVar36._12_4_ = fVar29;
      auVar20 = vdivps_avx(auVar28,auVar36);
      uVar15 = vmovlps_avx(auVar20);
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar15;
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar15 >> 0x20);
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z =
           local_40.w.super_Tuple3<pbrt::Vector3,_float>.z / fVar29;
      __return_storage_ptr__->phi = fVar14 + fVar1;
      __return_storage_ptr__->theta_o = __x;
      __return_storage_ptr__->theta_e = auVar24._0_4_;
      fVar14 = cosf(__x);
      __return_storage_ptr__->cosTheta_o = fVar14;
      fVar14 = cosf(auVar24._0_4_);
      __return_storage_ptr__->cosTheta_e = fVar14;
      __return_storage_ptr__->twoSided = (bool)(bVar13 | bVar12);
      return __return_storage_ptr__;
    }
    uVar15._0_4_ = (a->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar15._4_4_ = (a->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar16 = *(undefined8 *)&(a->b).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar17._0_4_ = (a->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar17._4_4_ = (a->b).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar18._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar18._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar19._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar19._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar21._0_4_ = a->phi;
    uVar21._4_4_ = a->theta_o;
    uVar22._0_4_ = a->theta_e;
    uVar22._4_4_ = a->cosTheta_o;
    uVar23._0_4_ = a->cosTheta_e;
    uVar23._4_1_ = a->twoSided;
    uVar23._5_3_ = *(undefined3 *)&a->field_0x39;
  }
  else {
    uVar15._0_4_ = (b->b).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar15._4_4_ = (b->b).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar16 = *(undefined8 *)&(b->b).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar17._0_4_ = (b->b).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar17._4_4_ = (b->b).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar18._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar18._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar19._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar19._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar21._0_4_ = b->phi;
    uVar21._4_4_ = b->theta_o;
    uVar22._0_4_ = b->theta_e;
    uVar22._4_4_ = b->cosTheta_o;
    uVar23._0_4_ = b->cosTheta_e;
    uVar23._4_1_ = b->twoSided;
    uVar23._5_3_ = *(undefined3 *)&b->field_0x39;
  }
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)uVar19;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)uVar19 >> 0x20);
  __return_storage_ptr__->phi = (Float)(int)uVar21;
  __return_storage_ptr__->theta_o = (Float)(int)((ulong)uVar21 >> 0x20);
  __return_storage_ptr__->theta_e = (Float)(int)uVar22;
  __return_storage_ptr__->cosTheta_o = (Float)(int)((ulong)uVar22 >> 0x20);
  __return_storage_ptr__->cosTheta_e = (Float)(int)uVar23;
  __return_storage_ptr__->twoSided = (bool)(char)((ulong)uVar23 >> 0x20);
  *(int3 *)&__return_storage_ptr__->field_0x39 = (int3)((ulong)uVar23 >> 0x28);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar15;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar15 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar16;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar17;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar17 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar18;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar18 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

LightBounds Union(const LightBounds &a, const LightBounds &b) {
    if (a.phi == 0)
        return b;
    if (b.phi == 0)
        return a;
    DirectionCone c =
        Union(DirectionCone(a.w, a.cosTheta_o), DirectionCone(b.w, b.cosTheta_o));
    Float theta_o = SafeACos(c.cosTheta);
    return LightBounds(Union(a.b, b.b), c.w, a.phi + b.phi, theta_o,
                       std::max(a.theta_e, b.theta_e), a.twoSided | b.twoSided);
}